

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O0

Stream * __thiscall
kratos::Stream::operator<<
          (Stream *this,
          pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *port)

{
  char cVar1;
  ulong uVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  ostream *poVar4;
  string *psVar5;
  Port *port_00;
  string local_a0;
  string_view local_80;
  string local_60;
  string_view local_40;
  type *local_30;
  type *end;
  type *p;
  pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *port_local;
  Stream *this_local;
  
  p = &port->first;
  local_18 = port;
  port_local = (pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)this;
  end = (type *)std::get<0ul,kratos::Port*,std::__cxx11::string>(port);
  local_30 = std::get<1ul,kratos::Port*,std::__cxx11::string>
                       ((pair<kratos::Port_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)p);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_40 = SystemVerilogCodeGen::indent
                         (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
    pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                             &(this->super_stringstream).field_0x10,local_40);
    poVar4 = std::operator<<(pbVar3,"// ");
    strip_newline(&local_60,(string *)(*(long *)end + 0x28));
    poVar4 = std::operator<<(poVar4,(string *)&local_60);
    cVar1 = endl(this);
    std::operator<<(poVar4,cVar1);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if ((*(byte *)(*(long *)&(this->super_stringstream).field_0x80 + 0xbc) & 1) != 0) {
    *(int *)(*(long *)end + 0x20) = (int)*(undefined8 *)&(this->super_stringstream).field_0x90;
  }
  local_80 = SystemVerilogCodeGen::indent
                       (*(SystemVerilogCodeGen **)&(this->super_stringstream).field_0x88);
  pbVar3 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                           &(this->super_stringstream).field_0x10,local_80);
  psVar5 = Var::before_var_str_abi_cxx11_(*(Var **)end);
  poVar4 = std::operator<<(pbVar3,(string *)psVar5);
  SystemVerilogCodeGen::get_port_str_abi_cxx11_(&local_a0,*(SystemVerilogCodeGen **)end,port_00);
  poVar4 = std::operator<<(poVar4,(string *)&local_a0);
  psVar5 = Var::after_var_str_abi_cxx11_(*(Var **)end);
  poVar4 = std::operator<<(poVar4,(string *)psVar5);
  poVar4 = std::operator<<(poVar4,(string *)local_30);
  cVar1 = endl(this);
  std::operator<<(poVar4,cVar1);
  std::__cxx11::string::~string((string *)&local_a0);
  return this;
}

Assistant:

Stream& Stream::operator<<(const std::pair<Port*, std::string>& port) {
    const auto& [p, end] = port;
    if (!p->comment.empty())
        (*this) << codegen_->indent() << "// " << strip_newline(p->comment) << endl();
    if (generator_->debug) {
        p->verilog_ln = line_no_;
    }

    (*this) << codegen_->indent() << p->before_var_str() << SystemVerilogCodeGen::get_port_str(p)
            << p->after_var_str() << end << endl();

    return *this;
}